

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

bool __thiscall
JsUtil::
BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::Remove(BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
         *this,Value **key)

{
  int iVar1;
  Type piVar2;
  Type pSVar3;
  uint uVar4;
  ulong in_RAX;
  bool bVar5;
  uint unaff_R13D;
  uint uVar6;
  uint depth;
  ulong uStack_38;
  
  piVar2 = this->buckets;
  depth = 0;
  if (piVar2 == (Type)0x0) {
    uVar6 = 0;
    uStack_38 = in_RAX;
  }
  else {
    uVar4 = GetBucket((uint)((ulong)*key >> 3) | 1,this->bucketCount,this->modFunctionIndex);
    uStack_38 = (ulong)uVar4 << 0x20;
    unaff_R13D = piVar2[uVar4];
    if (-1 < (long)(int)unaff_R13D) {
      pSVar3 = this->entries;
      if (pSVar3[(int)unaff_R13D].
          super_DefaultHashedEntry<Value_*,_Value_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
          .super_ImplicitKeyValueEntry<Value_*,_Value_*>.
          super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::ValueEntryData<Value_*>_>.
          super_ValueEntryData<Value_*>.value == *key) {
        depth = 0;
        uVar6 = 0xffffffff;
      }
      else {
        depth = 0;
        do {
          uVar6 = unaff_R13D;
          depth = depth + 1;
          unaff_R13D = pSVar3[uVar6].
                       super_DefaultHashedEntry<Value_*,_Value_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                       .super_ImplicitKeyValueEntry<Value_*,_Value_*>.
                       super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::ValueEntryData<Value_*>_>
                       .super_ValueEntryData<Value_*>.next;
          if ((long)(int)unaff_R13D < 0) goto LAB_00482fad;
        } while (pSVar3[(int)unaff_R13D].
                 super_DefaultHashedEntry<Value_*,_Value_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                 .super_ImplicitKeyValueEntry<Value_*,_Value_*>.
                 super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::ValueEntryData<Value_*>_>.
                 super_ValueEntryData<Value_*>.value != *key);
      }
      bVar5 = true;
      if (this->stats != (DictionaryStats *)0x0) {
        DictionaryStats::Lookup(this->stats,depth);
      }
      goto LAB_00482fc1;
    }
    uVar6 = 0xffffffff;
  }
LAB_00482fad:
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this->stats,depth);
  }
  bVar5 = false;
LAB_00482fc1:
  if (bVar5 != false) {
    iVar1 = this->entries[(int)unaff_R13D].
            super_DefaultHashedEntry<Value_*,_Value_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
            .super_ImplicitKeyValueEntry<Value_*,_Value_*>.
            super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::ValueEntryData<Value_*>_>.
            super_ValueEntryData<Value_*>.next;
    if ((int)uVar6 < 0) {
      this->buckets[uStack_38 >> 0x20] = iVar1;
    }
    else {
      this->entries[uVar6].
      super_DefaultHashedEntry<Value_*,_Value_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
      .super_ImplicitKeyValueEntry<Value_*,_Value_*>.
      super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::ValueEntryData<Value_*>_>.
      super_ValueEntryData<Value_*>.next = iVar1;
    }
    this->entries[(int)unaff_R13D].
    super_DefaultHashedEntry<Value_*,_Value_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
    .super_ImplicitKeyValueEntry<Value_*,_Value_*>.
    super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::ValueEntryData<Value_*>_>.
    super_ValueEntryData<Value_*>.value = (Value *)0x0;
    SetNextFreeEntryIndex
              (this,this->entries + (int)unaff_R13D,-(uint)(this->freeCount == 0) | this->freeList);
    this->freeList = unaff_R13D;
    this->freeCount = this->freeCount + 1;
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Remove(this->stats,this->buckets[uStack_38 >> 0x20] == -1);
    }
  }
  return bVar5;
}

Assistant:

bool Remove(const TKey& key)
        {
            int i, last;
            uint targetBucket;
            if(FindEntryWithKey(key, &i, &last, &targetBucket))
            {
                RemoveAt(i, last, targetBucket);
                return true;
            }
            return false;
        }